

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_AddRepeatedMessage_Test::TestBody
          (GeneratedMessageReflectionTest_AddRepeatedMessage_Test *this)

{
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  Message *message_00;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>_>
  *pVVar1;
  char *message_01;
  string_view name;
  Metadata MVar2;
  Metadata MVar3;
  Metadata MVar4;
  AssertionResult gtest_ar;
  TestAllTypes message;
  Message local_390;
  AssertHelper local_388;
  undefined1 local_380 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  undefined1 local_360 [832];
  
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_360,(Arena *)0x0);
  MVar2 = proto2_unittest::TestAllTypes::GetMetadata
                    ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
  MVar3 = proto2_unittest::TestAllTypes_NestedMessage::GetMetadata
                    ((TestAllTypes_NestedMessage *)
                     &proto2_unittest::_TestAllTypes_NestedMessage_default_instance_);
  MVar4 = proto2_unittest::TestAllTypes_NestedMessage::GetMetadata
                    ((TestAllTypes_NestedMessage *)
                     &proto2_unittest::_TestAllTypes_NestedMessage_default_instance_);
  name._M_str = "bb";
  name._M_len = 2;
  field = Descriptor::FindFieldByName(MVar4.descriptor,name);
  local_380 = (undefined1  [8])&local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"repeated_nested_message","");
  field_00 = F((string *)local_380);
  message_00 = Reflection::AddMessage
                         (MVar2.reflection,(Message *)local_360,field_00,(MessageFactory *)0x0);
  if (local_380 != (undefined1  [8])&local_370) {
    operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
  }
  Reflection::SetInt32(MVar3.reflection,message_00,field,0xb);
  local_390.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0xb;
  pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                     ((RepeatedPtrFieldBase *)(local_360 + 0x138),0);
  local_388.data_._0_4_ = (pVVar1->field_0)._impl_.bb_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_380,"11","message.repeated_nested_message(0).bb()",(int *)&local_390,
             (int *)&local_388);
  if (local_380[0] == (string)0x0) {
    testing::Message::Message(&local_390);
    if (local_378 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message_01 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message_01 = (local_378->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x419,message_01);
    testing::internal::AssertHelper::operator=(&local_388,&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if ((long *)CONCAT44(local_390.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_390.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_390.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_390.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_378 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_378,local_378);
  }
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_360);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, AddRepeatedMessage) {
  unittest::TestAllTypes message;

  const Reflection* reflection = message.GetReflection();
  const Reflection* nested_reflection =
      unittest::TestAllTypes::NestedMessage::default_instance().GetReflection();

  const FieldDescriptor* nested_bb =
      unittest::TestAllTypes::NestedMessage::descriptor()->FindFieldByName(
          "bb");

  Message* nested =
      reflection->AddMessage(&message, F("repeated_nested_message"));
  nested_reflection->SetInt32(nested, nested_bb, 11);

  EXPECT_EQ(11, message.repeated_nested_message(0).bb());
}